

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

char * __thiscall bsplib::exception::what(exception *this)

{
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_buf,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return (this->m_buf)._M_dataplus._M_p;
}

Assistant:

virtual const char * what() const throw()
    { m_buf = m_stream.str();
      return m_buf.c_str(); 
    }